

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupToLevel(int remaining,bool apply_focus_to_window_under)

{
  int *piVar1;
  ImGuiPopupRef *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow **ppIVar4;
  ImGuiPopupRef *__dest;
  ImGuiWindow *window;
  ImGuiContext *ctx;
  int iVar5;
  
  pIVar3 = GImGui;
  pIVar2 = (GImGui->OpenPopupStack).Data;
  ppIVar4 = &pIVar2[(ulong)(uint)remaining - 1].Window;
  if (remaining < 1) {
    ppIVar4 = &pIVar2->ParentWindow;
  }
  window = *ppIVar4;
  iVar5 = (GImGui->OpenPopupStack).Capacity;
  if (iVar5 < remaining) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= remaining) {
      iVar5 = remaining;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar5 * 0x30,GImAllocatorUserData);
    pIVar2 = (pIVar3->OpenPopupStack).Data;
    if (pIVar2 != (ImGuiPopupRef *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar3->OpenPopupStack).Size * 0x30);
      pIVar2 = (pIVar3->OpenPopupStack).Data;
      if ((pIVar2 != (ImGuiPopupRef *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar3->OpenPopupStack).Data = __dest;
    (pIVar3->OpenPopupStack).Capacity = iVar5;
  }
  (pIVar3->OpenPopupStack).Size = remaining;
  if (apply_focus_to_window_under) {
    if ((pIVar3->NavLayer == ImGuiNavLayer_Main) &&
       (window->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      window = window->NavLastChildNavWindow;
    }
    FocusWindow(window);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool apply_focus_to_window_under)
{
    IM_ASSERT(remaining >= 0);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* focus_window = (remaining > 0) ? g.OpenPopupStack[remaining-1].Window : g.OpenPopupStack[0].ParentWindow;
    g.OpenPopupStack.resize(remaining);

    // FIXME: This code is faulty and we may want to eventually to replace or remove the 'apply_focus_to_window_under=true' path completely.
    // Instead of using g.OpenPopupStack[remaining-1].Window etc. we should find the highest root window that is behind the popups we are closing.
    // The current code will set focus to the parent of the popup window which is incorrect. 
    // It rarely manifested until now because UpdateMouseMovingWindow() would call FocusWindow() again on the clicked window, 
    // leading to a chain of focusing A (clicked window) then B (parent window of the popup) then A again.
    // However if the clicked window has the _NoMove flag set we would be left with B focused.
    // For now, we have disabled this path when called from ClosePopupsOverWindow() because the users of ClosePopupsOverWindow() don't need to alter focus anyway,
    // but we should inspect and fix this properly.
    if (apply_focus_to_window_under)
    {
        if (g.NavLayer == 0)
            focus_window = NavRestoreLastChildNavWindow(focus_window);
        FocusWindow(focus_window);
    }
}